

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O2

string * __thiscall
pstack::Reader::readString_abi_cxx11_(string *__return_storage_ptr__,Reader *this,Off offset)

{
  int iVar1;
  int iVar2;
  undefined8 in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uStack_38;
  char c;
  
  if (offset == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"(null)",(allocator<char> *)((long)&uStack_38 + 6));
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    uStack_38 = in_RAX;
    iVar1 = (*this->_vptr_Reader[8])(this);
    for (; offset < CONCAT44(extraout_var,iVar1); offset = offset + 1) {
      iVar2 = (*this->_vptr_Reader[2])(this,offset,1,(long)&uStack_38 + 7);
      if (CONCAT44(extraout_var_00,iVar2) != 1) {
        return __return_storage_ptr__;
      }
      if (uStack_38._7_1_ == '\0') {
        return __return_storage_ptr__;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,uStack_38._7_1_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string
Reader::readString(Off offset) const
{
    if (offset == 0)
        return "(null)";
    string res;
    for (Off s = size(); offset < s; ++offset) {
        char c;
        if (read(offset, 1, &c) != 1)
            break;
        if (c == 0)
            break;
        res += c;
    }
    return res;
}